

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffgext(fitsfile *fptr,int hdunum,int *exttype,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  LONGLONG LVar3;
  int iVar4;
  int iVar5;
  
  if (0 < *status) {
    return *status;
  }
  iVar4 = ffmbyt(fptr,fptr->Fptr->headstart[hdunum],0,status);
  if (iVar4 < 1) {
    pFVar2 = fptr->Fptr;
    iVar4 = pFVar2->curhdu;
    iVar1 = pFVar2->maxhdu;
    LVar3 = pFVar2->headend;
    pFVar2->curhdu = hdunum;
    fptr->HDUposition = hdunum;
    if (hdunum < iVar1) {
      hdunum = iVar1;
    }
    pFVar2->maxhdu = hdunum;
    pFVar2->headend = pFVar2->logfilesize;
    iVar5 = ffrhdu(fptr,exttype,status);
    if (0 < iVar5) {
      pFVar2 = fptr->Fptr;
      pFVar2->curhdu = iVar4;
      fptr->HDUposition = iVar4;
      pFVar2->maxhdu = iVar1;
      pFVar2->headend = LVar3;
    }
  }
  return *status;
}

Assistant:

int ffgext(fitsfile *fptr,      /* I - FITS file pointer                */
           int hdunum,          /* I - no. of HDU to move get (0 based) */ 
           int *exttype,        /* O - type of extension, 0, 1, or 2    */
           int *status)         /* IO - error status                    */
/*
  Get Extension.  Move to the specified extension and initialize the
  HDU structure.
*/
{
    int xcurhdu, xmaxhdu;
    LONGLONG xheadend;

    if (*status > 0)
        return(*status);

    if (ffmbyt(fptr, (fptr->Fptr)->headstart[hdunum], REPORT_EOF, status) <= 0)
    {
        /* temporarily save current values, in case of error */
        xcurhdu = (fptr->Fptr)->curhdu;
        xmaxhdu = (fptr->Fptr)->maxhdu;
        xheadend = (fptr->Fptr)->headend;

        /* set new parameter values */
        (fptr->Fptr)->curhdu = hdunum;
        fptr->HDUposition    = hdunum;
        (fptr->Fptr)->maxhdu = maxvalue((fptr->Fptr)->maxhdu, hdunum);
        (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize; /* set max size */

        if (ffrhdu(fptr, exttype, status) > 0)
        {   /* failed to get the new HDU, so restore previous values */
            (fptr->Fptr)->curhdu = xcurhdu;
            fptr->HDUposition    = xcurhdu;
            (fptr->Fptr)->maxhdu = xmaxhdu;
            (fptr->Fptr)->headend = xheadend;
        }
    }
    return(*status);
}